

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O0

Node * cookmem::PtrAVLTree::balance(Node **stack,int16_t depth)

{
  short sVar1;
  Node *node;
  Node *node_00;
  Node *node_01;
  int16_t iVar2;
  int16_t iVar3;
  int16_t diff;
  int16_t oldHeight;
  Node *right;
  Node *left;
  Node *root;
  int16_t depth_local;
  Node **stack_local;
  
  root._6_2_ = depth;
  do {
    while( true ) {
      while( true ) {
        root._6_2_ = root._6_2_ + -1;
        node = stack[root._6_2_];
        node_00 = node->left;
        node_01 = node->right;
        sVar1 = node->height;
        iVar2 = getHeight(node_00);
        iVar3 = getHeight(node_01);
        if ((short)(iVar2 - iVar3) < 2) break;
        iVar2 = getHeight(node_00->left);
        iVar3 = getHeight(node_00->right);
        if (iVar2 < iVar3) {
          left = doubleWithLeftChild(node);
        }
        else {
          left = rotateWithLeftChild(node);
        }
        if (root._6_2_ == 0) {
          return left;
        }
        setParent(left,stack[root._6_2_ + -1]);
      }
      if (-2 < (short)(iVar2 - iVar3)) break;
      iVar2 = getHeight(node_01->right);
      iVar3 = getHeight(node_01->left);
      if (iVar2 < iVar3) {
        left = doubleWithRightChild(node);
      }
      else {
        left = rotateWithRightChild(node);
      }
      if (root._6_2_ == 0) {
        return left;
      }
      setParent(left,stack[root._6_2_ + -1]);
    }
    updateHeight(node);
    if (root._6_2_ == 0) {
      return node;
    }
  } while (sVar1 != node->height);
  return (Node *)0x0;
}

Assistant:

inline static Node*
    balance (Node** stack, std::int16_t depth)
    {
        for (;;)
        {
            --depth;
            Node* root = stack[depth];
            Node* left = root->left;
            Node* right = root->right;

            std::int16_t oldHeight = root->height;
            int16_t diff = getHeight (left) - getHeight (right);
            if (diff > 1)
            {
                if (getHeight (left->left) >= getHeight (left->right))
                {
                    root = rotateWithLeftChild (root);
                }
                else
                {
                    root = doubleWithLeftChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else if (diff < -1)
            {
                if (getHeight (right->right) >= getHeight (right->left))
                {
                    root = rotateWithRightChild (root);
                }
                else
                {
                    root = doubleWithRightChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else
            {
                updateHeight (root);
            }

            if (depth == 0)
            {
                return root;
            }

            if (oldHeight == root->height)
                break;
        }
        return nullptr;
    }